

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_monitor.cpp
# Opt level: O3

void __thiscall
r_exec::PMonitor::PMonitor
          (PMonitor *this,MDLController *controller,BindingMap *bindings,Fact *prediction,
          bool rate_failures)

{
  atomic_int_fast64_t *paVar1;
  Pred *this_00;
  _Fact *reference_fact;
  TimeJob *this_01;
  uint64_t uVar2;
  long lVar3;
  _Mem *this_02;
  
  Monitor::Monitor(&this->super_Monitor,controller,bindings,prediction);
  (this->super_Monitor).super__Object._vptr__Object = (_func_int **)&PTR__PMonitor_001c0b60;
  this->rate_failures = rate_failures;
  this_00 = _Fact::get_pred(&prediction->super__Fact);
  reference_fact = Pred::get_target(this_00);
  this->prediction_target = reference_fact;
  BindingMap::reset_fwd_timings(bindings,reference_fact);
  this_01 = (TimeJob *)operator_new(0x28);
  uVar2 = _Fact::get_before(this->prediction_target);
  lVar3 = r_code::Utils::GetTimeTolerance();
  TimeJob::TimeJob(this_01,lVar3 + uVar2);
  (this_01->super__Object)._vptr__Object = (_func_int **)&PTR__MonitoringJob_001c0ba0;
  this_01[1].super__Object._vptr__Object = (_func_int **)this;
  LOCK();
  paVar1 = &(this->super_Monitor).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  this_02 = (_Mem *)r_code::Mem::Get();
  _Mem::pushTimeJob(this_02,this_01);
  return;
}

Assistant:

PMonitor::PMonitor(MDLController *controller,
                   BindingMap *bindings,
                   Fact *prediction,
                   bool rate_failures): Monitor(controller, bindings, prediction), rate_failures(rate_failures)   // prediction is f0->pred->f1->obj; not simulated.
{
    prediction_target = prediction->get_pred()->get_target(); // f1.
    bindings->reset_fwd_timings(prediction_target);
    MonitoringJob<PMonitor> *j = new MonitoringJob<PMonitor>(this, prediction_target->get_before() + Utils::GetTimeTolerance());
    _Mem::Get()->pushTimeJob(j);
}